

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O0

void calc_proj_params_r0_r1_high_bd_avx2
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  int in_ECX;
  int iVar7;
  ulong in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined1 auVar8 [32];
  __m128i v;
  __m128i v_00;
  __m128i v_01;
  long in_stack_00000008;
  undefined4 in_stack_0000001c;
  undefined4 in_stack_0000002c;
  __m256i h1x_high;
  __m256i h1x_low;
  __m128i h0x_128bit;
  __m256i h0x_high;
  __m256i h0x_low;
  __m128i c_128bit;
  __m256i c_high;
  __m256i c_low;
  __m256i c1_odd;
  __m256i c1_even;
  __m256i c0_odd;
  __m256i c0_even;
  __m256i h11_odd;
  __m256i h11_even;
  __m256i h01_odd;
  __m256i h01_even;
  __m256i h00_odd;
  __m256i h00_even;
  __m256i s;
  __m256i d;
  __m256i f2;
  __m256i f1;
  __m256i s_load;
  __m256i u_load;
  int j;
  int i;
  __m256i zero;
  __m256i c1;
  __m256i c0;
  __m256i h11;
  __m256i h01;
  __m256i h00;
  uint16_t *dat;
  uint16_t *src;
  int size;
  int local_d68;
  int local_d64;
  undefined1 local_d40 [32];
  undefined1 local_d20 [32];
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  
  iVar7 = (int)in_RDX;
  iVar6 = (int)in_RSI * iVar7;
  local_d40 = ZEXT1632(ZEXT816(0));
  local_d20 = local_d40;
  local_d00 = local_d40;
  local_ce0 = local_d40;
  local_cc0 = local_d40;
  for (local_d64 = 0; local_d64 < iVar7; local_d64 = local_d64 + 1) {
    for (local_d68 = 0; local_d68 < (int)in_RSI; local_d68 = local_d68 + 8) {
      auVar1 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                               (in_R8 * 2 + (long)(local_d64 * in_R9D) * 2 + (long)local_d68 * 2));
      auVar2 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                               (in_RDI * 2 + (long)(local_d64 * in_ECX) * 2 + (long)local_d68 * 2));
      in_RDX = (ulong)flt1 & 0xffffffff;
      auVar1 = vpslld_avx2(auVar1,ZEXT416(4));
      auVar2 = vpslld_avx2(auVar2,ZEXT416(4));
      auVar8 = vpsubd_avx2(auVar2,auVar1);
      auVar4 = vpsubd_avx2(*(undefined1 (*) [32])
                            (in_stack_00000008 + (long)(local_d64 * (int)flt0) * 4 +
                            (long)local_d68 * 4),auVar1);
      auVar5 = vpsubd_avx2(*(undefined1 (*) [32])
                            (CONCAT44(in_stack_0000001c,flt0_stride) +
                             (long)(local_d64 * (int)flt1) * 4 + (long)local_d68 * 4),auVar1);
      auVar1 = vpmuldq_avx2(auVar4,auVar4);
      auVar2 = vpsrlq_avx2(auVar4,ZEXT416(0x20));
      auVar3 = vpsrlq_avx2(auVar4,ZEXT416(0x20));
      auVar2 = vpmuldq_avx2(auVar2,auVar3);
      auVar1 = vpaddq_avx2(local_cc0,auVar1);
      local_cc0 = vpaddq_avx2(auVar1,auVar2);
      auVar1 = vpmuldq_avx2(auVar4,auVar5);
      auVar2 = vpsrlq_avx2(auVar4,ZEXT416(0x20));
      auVar3 = vpsrlq_avx2(auVar5,ZEXT416(0x20));
      auVar2 = vpmuldq_avx2(auVar2,auVar3);
      auVar1 = vpaddq_avx2(local_ce0,auVar1);
      local_ce0 = vpaddq_avx2(auVar1,auVar2);
      auVar1 = vpmuldq_avx2(auVar5,auVar5);
      auVar2 = vpsrlq_avx2(auVar5,ZEXT416(0x20));
      auVar3 = vpsrlq_avx2(auVar5,ZEXT416(0x20));
      auVar2 = vpmuldq_avx2(auVar2,auVar3);
      auVar1 = vpaddq_avx2(local_d00,auVar1);
      local_d00 = vpaddq_avx2(auVar1,auVar2);
      auVar1 = vpmuldq_avx2(auVar4,auVar8);
      auVar2 = vpsrlq_avx2(auVar4,ZEXT416(0x20));
      auVar3 = vpsrlq_avx2(auVar8,ZEXT416(0x20));
      auVar2 = vpmuldq_avx2(auVar2,auVar3);
      auVar1 = vpaddq_avx2(local_d20,auVar1);
      local_d20 = vpaddq_avx2(auVar1,auVar2);
      auVar1 = vpmuldq_avx2(auVar5,auVar8);
      auVar2 = vpsrlq_avx2(auVar5,ZEXT416(0x20));
      auVar3 = vpsrlq_avx2(auVar8,ZEXT416(0x20));
      auVar8 = vpsllq_avx2(auVar2,0x20);
      auVar8 = vpsrad_avx2(auVar8,0x1f);
      vpblendd_avx2(auVar2,auVar8,0xaa);
      auVar8 = vpsllq_avx2(auVar3,0x20);
      auVar8 = vpsrad_avx2(auVar8,0x1f);
      vpblendd_avx2(auVar3,auVar8,0xaa);
      auVar2 = vpmuldq_avx2(auVar2,auVar3);
      auVar1 = vpaddq_avx2(local_d40,auVar1);
      local_d40 = vpaddq_avx2(auVar1,auVar2);
    }
  }
  auVar2 = vpunpcklqdq_avx2(local_d20,local_d40);
  auVar1 = vpunpckhqdq_avx2(local_d20,local_d40);
  auVar1 = vpaddq_avx2(auVar2,auVar1);
  vpaddq_avx(auVar1._16_16_,auVar1._0_16_);
  auVar2 = vpunpcklqdq_avx2(local_cc0,local_ce0);
  auVar1 = vpunpckhqdq_avx2(local_cc0,local_ce0);
  auVar1 = vpaddq_avx2(auVar2,auVar1);
  vpaddq_avx(auVar1._16_16_,auVar1._0_16_);
  auVar2 = vpunpcklqdq_avx2(ZEXT1632(ZEXT816(0)),local_d00);
  auVar1 = vpunpckhqdq_avx2(ZEXT1632(ZEXT816(0)),local_d00);
  auVar1 = vpaddq_avx2(auVar2,auVar1);
  vpaddq_avx(auVar1._16_16_,auVar1._0_16_);
  v[1] = in_RDX;
  v[0] = in_RSI;
  xx_storeu_128(H,v);
  v_00[1] = extraout_RDX;
  v_00[0] = in_RSI;
  xx_storeu_128((void *)CONCAT44(in_stack_0000002c,flt1_stride),v_00);
  v_01[1] = extraout_RDX_00;
  v_01[0] = in_RSI;
  xx_storeu_128((void *)(CONCAT44(in_stack_0000002c,flt1_stride) + 0x10),v_01);
  *(long *)CONCAT44(in_stack_0000002c,flt1_stride) =
       *(long *)CONCAT44(in_stack_0000002c,flt1_stride) / (long)iVar6;
  *(long *)(CONCAT44(in_stack_0000002c,flt1_stride) + 8) =
       *(long *)(CONCAT44(in_stack_0000002c,flt1_stride) + 8) / (long)iVar6;
  *(long *)(CONCAT44(in_stack_0000002c,flt1_stride) + 0x18) =
       *(long *)(CONCAT44(in_stack_0000002c,flt1_stride) + 0x18) / (long)iVar6;
  *(undefined8 *)(CONCAT44(in_stack_0000002c,flt1_stride) + 0x10) =
       *(undefined8 *)(CONCAT44(in_stack_0000002c,flt1_stride) + 8);
  (*H)[0] = (*H)[0] / (long)iVar6;
  (*H)[1] = (*H)[1] / (long)iVar6;
  return;
}

Assistant:

static inline void calc_proj_params_r0_r1_high_bd_avx2(
    const uint8_t *src8, int width, int height, int src_stride,
    const uint8_t *dat8, int dat_stride, int32_t *flt0, int flt0_stride,
    int32_t *flt1, int flt1_stride, int64_t H[2][2], int64_t C[2]) {
  const int size = width * height;
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dat = CONVERT_TO_SHORTPTR(dat8);
  __m256i h00, h01, h11, c0, c1;
  const __m256i zero = _mm256_setzero_si256();
  h01 = h11 = c0 = c1 = h00 = zero;

  for (int i = 0; i < height; ++i) {
    for (int j = 0; j < width; j += 8) {
      const __m256i u_load = _mm256_cvtepu16_epi32(
          _mm_load_si128((__m128i *)(dat + i * dat_stride + j)));
      const __m256i s_load = _mm256_cvtepu16_epi32(
          _mm_load_si128((__m128i *)(src + i * src_stride + j)));
      __m256i f1 = _mm256_loadu_si256((__m256i *)(flt0 + i * flt0_stride + j));
      __m256i f2 = _mm256_loadu_si256((__m256i *)(flt1 + i * flt1_stride + j));
      __m256i d = _mm256_slli_epi32(u_load, SGRPROJ_RST_BITS);
      __m256i s = _mm256_slli_epi32(s_load, SGRPROJ_RST_BITS);
      s = _mm256_sub_epi32(s, d);
      f1 = _mm256_sub_epi32(f1, d);
      f2 = _mm256_sub_epi32(f2, d);

      const __m256i h00_even = _mm256_mul_epi32(f1, f1);
      const __m256i h00_odd = _mm256_mul_epi32(_mm256_srli_epi64(f1, 32),
                                               _mm256_srli_epi64(f1, 32));
      h00 = _mm256_add_epi64(h00, h00_even);
      h00 = _mm256_add_epi64(h00, h00_odd);

      const __m256i h01_even = _mm256_mul_epi32(f1, f2);
      const __m256i h01_odd = _mm256_mul_epi32(_mm256_srli_epi64(f1, 32),
                                               _mm256_srli_epi64(f2, 32));
      h01 = _mm256_add_epi64(h01, h01_even);
      h01 = _mm256_add_epi64(h01, h01_odd);

      const __m256i h11_even = _mm256_mul_epi32(f2, f2);
      const __m256i h11_odd = _mm256_mul_epi32(_mm256_srli_epi64(f2, 32),
                                               _mm256_srli_epi64(f2, 32));
      h11 = _mm256_add_epi64(h11, h11_even);
      h11 = _mm256_add_epi64(h11, h11_odd);

      const __m256i c0_even = _mm256_mul_epi32(f1, s);
      const __m256i c0_odd =
          _mm256_mul_epi32(_mm256_srli_epi64(f1, 32), _mm256_srli_epi64(s, 32));
      c0 = _mm256_add_epi64(c0, c0_even);
      c0 = _mm256_add_epi64(c0, c0_odd);

      const __m256i c1_even = _mm256_mul_epi32(f2, s);
      const __m256i c1_odd =
          _mm256_mul_epi32(_mm256_srli_epi64(f2, 32), _mm256_srli_epi64(s, 32));
      c1 = _mm256_add_epi64(c1, c1_even);
      c1 = _mm256_add_epi64(c1, c1_odd);
    }
  }

  __m256i c_low = _mm256_unpacklo_epi64(c0, c1);
  const __m256i c_high = _mm256_unpackhi_epi64(c0, c1);
  c_low = _mm256_add_epi64(c_low, c_high);
  const __m128i c_128bit = _mm_add_epi64(_mm256_extracti128_si256(c_low, 1),
                                         _mm256_castsi256_si128(c_low));

  __m256i h0x_low = _mm256_unpacklo_epi64(h00, h01);
  const __m256i h0x_high = _mm256_unpackhi_epi64(h00, h01);
  h0x_low = _mm256_add_epi64(h0x_low, h0x_high);
  const __m128i h0x_128bit = _mm_add_epi64(_mm256_extracti128_si256(h0x_low, 1),
                                           _mm256_castsi256_si128(h0x_low));

  // Using the symmetric properties of H,  calculations of H[1][0] are not
  // needed.
  __m256i h1x_low = _mm256_unpacklo_epi64(zero, h11);
  const __m256i h1x_high = _mm256_unpackhi_epi64(zero, h11);
  h1x_low = _mm256_add_epi64(h1x_low, h1x_high);
  const __m128i h1x_128bit = _mm_add_epi64(_mm256_extracti128_si256(h1x_low, 1),
                                           _mm256_castsi256_si128(h1x_low));

  xx_storeu_128(C, c_128bit);
  xx_storeu_128(H[0], h0x_128bit);
  xx_storeu_128(H[1], h1x_128bit);

  H[0][0] /= size;
  H[0][1] /= size;
  H[1][1] /= size;

  // Since H is a symmetric matrix
  H[1][0] = H[0][1];
  C[0] /= size;
  C[1] /= size;
}